

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_16bit_4chan(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  exr_coding_channel_info_t *peVar10;
  void *pvVar11;
  int iVar12;
  uint8_t *puVar13;
  int iVar14;
  ulong uVar15;
  uint8_t *puVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uint8_t *puVar21;
  long lVar22;
  long lVar23;
  uint8_t *puVar24;
  long lVar25;
  uint8_t *local_68;
  
  iVar14 = decode->user_line_begin_skip;
  iVar12 = (decode->chunk).height - decode->user_line_end_ignore;
  if (iVar14 < iVar12) {
    peVar10 = decode->channels;
    pvVar11 = decode->unpacked_buffer;
    uVar1 = peVar10->width;
    uVar15 = (ulong)uVar1;
    iVar2 = peVar10[3].user_pixel_stride;
    iVar3 = peVar10[2].user_pixel_stride;
    iVar4 = peVar10[1].user_pixel_stride;
    iVar5 = peVar10->user_pixel_stride;
    lVar19 = (long)(int)(uVar1 * 8);
    lVar17 = (long)(int)(uVar1 * 8 * iVar14);
    lVar22 = (long)pvVar11 + lVar17;
    local_68 = peVar10[3].field_12.decode_to_ptr;
    puVar24 = peVar10[2].field_12.decode_to_ptr;
    lVar20 = (long)(int)uVar1;
    puVar16 = peVar10[1].field_12.decode_to_ptr;
    lVar25 = lVar17 + lVar20 * 2 + (long)pvVar11;
    lVar23 = lVar17 + lVar20 * 4 + (long)pvVar11;
    lVar17 = lVar17 + lVar20 * 6 + (long)pvVar11;
    puVar21 = (peVar10->field_12).decode_to_ptr;
    iVar6 = peVar10[3].user_line_stride;
    iVar7 = peVar10[2].user_line_stride;
    iVar8 = peVar10[1].user_line_stride;
    iVar9 = peVar10->user_line_stride;
    do {
      if (0 < (int)uVar1) {
        uVar18 = 0;
        puVar13 = puVar21;
        do {
          *(undefined2 *)puVar13 = *(undefined2 *)(lVar22 + uVar18 * 2);
          uVar18 = uVar18 + 1;
          puVar13 = puVar13 + iVar5;
        } while (uVar15 != uVar18);
        if (0 < (int)uVar1) {
          uVar18 = 0;
          puVar13 = puVar16;
          do {
            *(undefined2 *)puVar13 = *(undefined2 *)(lVar25 + uVar18 * 2);
            uVar18 = uVar18 + 1;
            puVar13 = puVar13 + iVar4;
          } while (uVar15 != uVar18);
          if (0 < (int)uVar1) {
            uVar18 = 0;
            puVar13 = puVar24;
            do {
              *(undefined2 *)puVar13 = *(undefined2 *)(lVar23 + uVar18 * 2);
              uVar18 = uVar18 + 1;
              puVar13 = puVar13 + iVar3;
            } while (uVar15 != uVar18);
            if (0 < (int)uVar1) {
              uVar18 = 0;
              puVar13 = local_68;
              do {
                *(undefined2 *)puVar13 = *(undefined2 *)(lVar17 + uVar18 * 2);
                uVar18 = uVar18 + 1;
                puVar13 = puVar13 + iVar2;
              } while (uVar15 != uVar18);
            }
          }
        }
      }
      lVar22 = lVar22 + lVar19;
      puVar21 = puVar21 + iVar9;
      puVar16 = puVar16 + iVar8;
      puVar24 = puVar24 + iVar7;
      local_68 = local_68 + iVar6;
      iVar14 = iVar14 + 1;
      lVar25 = lVar25 + lVar19;
      lVar23 = lVar23 + lVar19;
      lVar17 = lVar17 + lVar19;
    } while (iVar14 < iVar12);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             inc0, inc1, inc2, inc3;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    inc3  = decode->channels[3].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += w * decode->user_line_begin_skip * 8;

    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out3 + x * inc3)) = one_to_native16 (in3[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}